

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprGlobalGetExpr
          (BinaryReaderIR *this,Index index,Index global_index)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  Location loc;
  Location local_90;
  Var local_70;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_90.field_1.field_0.last_column = 0;
  local_90.filename.size_ = strlen(__s);
  pEVar2 = this->current_init_expr_;
  local_90.filename.data_ = __s;
  local_90.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  Var::Var(&local_70,global_index,&local_90);
  pEVar4 = (Expr *)operator_new(0x88);
  (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar4->loc).filename.data_ = local_90.filename.data_;
  (pEVar4->loc).filename.size_ = local_90.filename.size_;
  (pEVar4->loc).field_1.field_1.offset = (size_t)local_90.field_1.field_1.offset;
  *(ulong *)((long)&(pEVar4->loc).field_1 + 8) =
       CONCAT44(local_90.field_1._12_4_,local_90.field_1.field_0.last_column);
  pEVar4->type_ = GlobalGet;
  pEVar4->_vptr_Expr = (_func_int **)&PTR__VarExpr_0019d200;
  Var::Var((Var *)(pEVar4 + 1),&local_70);
  if (((pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar4->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar3 = pEVar2->last_;
    pEVar5 = pEVar2;
    if (pEVar3 != (Expr *)0x0) {
      (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
      pEVar5 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar5->first_ = pEVar4;
    pEVar2->last_ = pEVar4;
    pEVar2->size_ = pEVar2->size_ + 1;
    Var::~Var(&local_70);
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnInitExprGlobalGetExpr(Index index,
                                               Index global_index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<GlobalGetExpr>(Var(global_index, loc), loc));
  return Result::Ok;
}